

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MGraph.c
# Opt level: O0

void BFS(Graph G)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 auStack_a018 [5013];
  undefined4 local_370;
  int local_35c;
  int local_358;
  int local_354;
  undefined8 *local_350;
  int local_344;
  int local_340;
  int k;
  int j;
  int i;
  int visited [100];
  int queue [100];
  int local_10;
  int local_c;
  int rear;
  int head;
  
  bVar5 = 0;
  local_350 = (undefined8 *)&stack0x00000008;
  local_c = 0;
  local_10 = 0;
  for (k = 0; k < (int)G.vexs._92_4_; k = k + 1) {
    (&j)[k] = 0;
  }
  printf("BFS: ");
  for (k = 0; k < *(int *)((long)local_350 + 100); k = k + 1) {
    if ((&j)[k] == 0) {
      (&j)[k] = 1;
      printf("%c",(ulong)(uint)(int)*(char *)((long)local_350 + (long)k));
      visited[(long)local_10 + 0x62] = k;
      local_10 = local_10 + 1;
    }
    while (local_c != local_10) {
      iVar1 = local_c + 1;
      local_354 = visited[(long)local_c + 0x62];
      puVar3 = local_350;
      puVar4 = auStack_a018;
      for (lVar2 = 0x1395; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      local_370 = *(undefined4 *)(local_350 + 0x1395);
      local_340 = local_354;
      for (local_344 = first_vertex(local_354); local_c = iVar1, -1 < local_344;
          local_344 = next_vertix(local_340,local_344)) {
        if ((&j)[local_344] == 0) {
          (&j)[local_344] = 1;
          printf("%c",(ulong)(uint)(int)*(char *)((long)local_350 + (long)local_344));
          visited[(long)local_10 + 0x62] = local_344;
          local_10 = local_10 + 1;
        }
        local_358 = local_340;
        local_35c = local_344;
        puVar3 = local_350;
        puVar4 = auStack_a018;
        for (lVar2 = 0x1395; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar4 = *puVar3;
          puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
          puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
        }
        local_370 = *(undefined4 *)(local_350 + 0x1395);
      }
    }
  }
  printf("\n");
  return;
}

Assistant:

void BFS(Graph G){
    int head = 0;
    int rear = 0;
    int queue[MAX]; //辅助队列
    int visited[MAX];   //顶点访问标记
    int i,j,k;
    for(i = 0;i < G.vexnum; i++){   //初始化访问数组
        visited[i] = 0;
    }
    printf("BFS: ");
    for(i = 0;i < G.vexnum;i++){
        if(!visited[i]){
            visited[i] = 1;
            printf("%c",G.vexs[i]);
            queue[rear++] = i;  //入队列
        }
        while (head != rear){
            j = queue[head++];  //出队列
            for(k  = first_vertex(G,j); k >= 0;k = next_vertix(G,j,k))   //k是访问的邻接结点
            {
                if(!visited[k]){
                    visited[k] = 1;
                    printf("%c",G.vexs[k]);
                    queue[rear++] = k;
                }
            }
        }
    }
    printf("\n");
}